

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O2

void __thiscall
hungarian_algorithm::
BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
::doSolve(BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
          *this,size_t row,CombinedCost *accumulated_cost)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  ulong uVar1;
  const_reference pdVar2;
  size_t col;
  ulong uVar3;
  reference rVar4;
  CombinedCost new_accumulated_cost;
  CombinedCost local_40;
  
  if (row < this->num_rows_) {
    this_00 = &this->covered_cols_;
    for (uVar3 = 0; uVar1 = this->num_cols_, uVar3 < uVar1; uVar3 = uVar3 + 1) {
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar3);
      if ((*rVar4._M_p & rVar4._M_mask) == 0) {
        pdVar2 = boost::numeric::ublas::
                 matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                 ::operator()(this->cost_function_,row,uVar3);
        local_40.second.rep_ = pdVar2->rep_ + (accumulated_cost->second).rep_;
        local_40.first = accumulated_cost->first;
        (this->current_assignment_).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[row] = uVar3;
        rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar3);
        *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
        doSolve(this,row + 1,&local_40);
        rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar3);
        *rVar4._M_p = *rVar4._M_p & ~rVar4._M_mask;
      }
    }
    if (uVar1 < this->num_rows_) {
      local_40.first = accumulated_cost->first + 1;
      local_40.second.rep_ = (accumulated_cost->second).rep_;
      (this->current_assignment_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[row] = uVar1;
      doSolve(this,row + 1,&local_40);
    }
  }
  else {
    uVar3 = (this->optimal_cost_).first;
    if ((accumulated_cost->first < uVar3) ||
       ((accumulated_cost->first == uVar3 &&
        ((this->optimal_cost_).second.rep_ < (accumulated_cost->second).rep_)))) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&this->optimal_assignment_,&this->current_assignment_);
      (this->optimal_cost_).first = accumulated_cost->first;
      if (&this->optimal_cost_ != accumulated_cost) {
        (this->optimal_cost_).second.rep_ = (accumulated_cost->second).rep_;
      }
    }
  }
  return;
}

Assistant:

void doSolve(const std::size_t row, const CombinedCost& accumulated_cost)
  {
    if (row < num_rows_)
    {
      for (std::size_t col = 0; col < num_cols_; ++col)
      {
        if (!covered_cols_[col])
        {
          const CombinedCost new_accumulated_cost(accumulated_cost.first,
                                                  accumulated_cost.second + cost_function_(Size(row), Size(col)));
          current_assignment_[row] = col;
          covered_cols_[col] = true;
          doSolve(row + 1, new_accumulated_cost);
          covered_cols_[col] = false;
        }
      }

      if (num_cols_ < num_rows_)
      {
        // One possibility is also an invalid assignment:
        const CombinedCost new_accumulated_cost(accumulated_cost.first + 1, accumulated_cost.second);
        current_assignment_[static_cast<std::size_t>(row)] = num_cols_;
        doSolve(row + 1, new_accumulated_cost);
      }
    }
    else if (isBetterThan(accumulated_cost, optimal_cost_))
    {
      optimal_assignment_ = current_assignment_;
      optimal_cost_ = accumulated_cost;
    }
  }